

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O1

void __thiscall imrt::Plan::writeIntensities(Plan *this,string *file,int n)

{
  char cVar1;
  _List_node_base *p_Var2;
  int angle5;
  int angle4;
  int angle3;
  int angle2;
  int angle1;
  double F;
  string line;
  ifstream myfile;
  int local_26c;
  int local_268;
  int local_264;
  int local_260;
  int local_25c [3];
  undefined1 *local_250;
  undefined8 local_248;
  undefined1 local_240 [16];
  double local_230 [65];
  
  std::ifstream::ifstream((string *)local_230);
  std::ifstream::open((string *)local_230,(_Ios_Openmode)file);
  local_248 = 0;
  local_240[0] = 0;
  local_250 = local_240;
  if (0 < n) {
    do {
      cVar1 = std::ios::widen((char)*(undefined8 *)((long)local_230[0] + -0x18) +
                              (char)(string *)local_230);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_230,(string *)&local_250,cVar1);
      n = n + -1;
    } while (n != 0);
  }
  std::istream::operator>>((istream *)local_230,local_25c);
  std::istream::operator>>((istream *)local_230,&local_260);
  std::istream::operator>>((istream *)local_230,&local_264);
  std::istream::operator>>((istream *)local_230,&local_268);
  std::istream::operator>>((istream *)local_230,&local_26c);
  std::istream::_M_extract<double>(local_230);
  p_Var2 = (_List_node_base *)&this->stations;
  while (p_Var2 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                   &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->stations) {
    Station::writeIntensity((Station *)p_Var2[1]._M_next,(ifstream *)local_230);
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

void Plan::writeIntensities(string file, int n) {
  	ifstream myfile;
  	myfile.open(file);

    std::string line;
    for(int i=0; i<n; i++) std::getline(myfile, line);

  	int angle1, angle2, angle3, angle4, angle5;
  	double F;
  	myfile >> angle1;
  	myfile >> angle2;
  	myfile >> angle3;
  	myfile >> angle4;
  	myfile >> angle5;
  	myfile >> F;

  	for(auto station:stations){
  		station->writeIntensity(myfile);
  	}

  }